

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_signed(lyout *out,int level,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
                     lys_module *module,lys_ext_instance **ext,uint ext_size,int attr_value)

{
  int iVar1;
  undefined7 in_register_00000009;
  char *local_38;
  char *str;
  
  iVar1 = asprintf(&local_38,"%d",(ulong)ext_size);
  if (iVar1 == -1) {
    ly_log(((lys_module *)CONCAT71(in_register_00000009,substmt_index))->ctx,LY_LLERR,LY_EMEM,
           "Memory allocation failed (%s()).","yin_print_signed");
  }
  else {
    yin_print_substmt(out,level,LYEXT_SUBSTMT_VALUE,(uint8_t)substmt,local_38,
                      (lys_module *)CONCAT71(in_register_00000009,substmt_index),
                      (lys_ext_instance **)module,(uint)ext);
    free(local_38);
  }
  return;
}

Assistant:

static void
yin_print_signed(struct lyout *out, int level, LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                 const struct lys_module *module, struct lys_ext_instance **ext, unsigned int ext_size,
                 signed int attr_value)
{
    char *str;

    if (asprintf(&str, "%d", attr_value) == -1) {
        LOGMEM(module->ctx);
    } else {
        yin_print_substmt(out, level, substmt, substmt_index, str, module, ext, ext_size);
        free(str);
    }
}